

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Events.c
# Opt level: O2

void event_exercise_time(tgestate_t *state)

{
  state->bell = '(';
  set_hero_route(state,(route_t *)&set_route_go_to_yard_reversed_t14);
  set_prisoners_and_guards_route_B(state,(route_t *)&set_route_go_to_yard_reversed_t14);
  return;
}

Assistant:

static void event_exercise_time(tgestate_t *state) // end of exercise time?
{
  assert(state != NULL);

  state->bell = bell_RING_40_TIMES;
  set_route_go_to_yard_reversed(state);
}